

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_cache.c
# Opt level: O0

int pt_bcache_lookup(pt_bcache_entry *bce,pt_block_cache *bcache,uint64_t index)

{
  uint64_t index_local;
  pt_block_cache *bcache_local;
  pt_bcache_entry *bce_local;
  
  if ((bce == (pt_bcache_entry *)0x0) || (bcache == (pt_block_cache *)0x0)) {
    bce_local._4_4_ = -1;
  }
  else if (index < bcache->nentries) {
    *bce = (pt_bcache_entry)bcache[(index & 0xffffffff) + 1].nentries;
    bce_local._4_4_ = 0;
  }
  else {
    bce_local._4_4_ = -1;
  }
  return bce_local._4_4_;
}

Assistant:

int pt_bcache_lookup(struct pt_bcache_entry *bce,
		     struct pt_block_cache *bcache, uint64_t index)
{
	if (!bce || !bcache)
		return -pte_internal;

	if (bcache->nentries <= index)
		return -pte_internal;

#if !defined(__STDC_NO_ATOMICS__)
	*bce = atomic_load(&bcache->entry[(uint32_t) index]);
#else
	*bce = bcache->entry[(uint32_t) index];
#endif
	return 0;
}